

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O3

uint __thiscall Costs::closestStateIndex(Costs *this,double *v,double *states,uint p)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  dVar1 = *v;
  uVar3 = 0;
  if (*states < dVar1) {
    uVar4 = p - 1;
    if (states[uVar4] <= dVar1) {
      return uVar4;
    }
    if (p != 0) {
      uVar5 = 0;
      do {
        uVar6 = p + uVar5;
        uVar3 = uVar6 >> 1;
        dVar2 = states[uVar3];
        if ((dVar2 == dVar1) && (!NAN(dVar2) && !NAN(dVar1))) {
          return uVar3;
        }
        if (dVar2 <= dVar1) {
          uVar5 = uVar3 + 1;
          if ((uVar3 < uVar4) && (dVar1 < states[uVar5])) {
            if (dVar1 + dVar1 < dVar2 + states[uVar5]) {
              uVar5 = uVar3;
            }
            return uVar5;
          }
        }
        else {
          p = uVar3;
          if (1 < uVar6) {
            if (states[uVar3 - 1] < dVar1) {
              if (dVar1 + dVar1 < dVar2 + states[uVar3 - 1]) {
                uVar3 = uVar3 - 1;
              }
              return uVar3;
            }
          }
        }
      } while (uVar5 < p);
    }
  }
  return uVar3;
}

Assistant:

unsigned int Costs::closestStateIndex(double& v, double* states, unsigned int p)
{
  if(v <= states[0]){return(0);}
  if(v >= states[p - 1]){return(p - 1);}

  // binary search
  unsigned int i = 0;
  unsigned int j = p;
  unsigned int mid = 0;
  while(i < j)
  {
    mid = (i + j)/2;
    if(states[mid] == v){return(mid);}

    if(v < states[mid])
    {
      if(mid > 0 && v > states[mid - 1])
        {if(states[mid - 1] + states[mid] > 2*v){return(mid - 1);}else{return(mid);}}
      j = mid;
    }
    else
    {
      if (mid < (p - 1) && v < states[mid + 1])
        {if(states[mid] + states[mid + 1] > 2*v){return(mid);}else{return(mid + 1);}}
      i = mid + 1;
    }
  }
  return(mid);
}